

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointAction::~IfcStructuralPointAction
          (IfcStructuralPointAction *this)

{
  IfcStructuralAction::~IfcStructuralAction
            (&this->super_IfcStructuralAction,&PTR_construction_vtable_24__008621e8);
  return;
}

Assistant:

IfcStructuralPointAction() : Object("IfcStructuralPointAction") {}